

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall
Assimp::IFC::Schema_2x3::IfcElementComponentType::~IfcElementComponentType
          (IfcElementComponentType *this)

{
  undefined1 *puVar1;
  
  *(undefined8 *)&this[-1].super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject.field_0x28
       = 0x87e208;
  *(undefined8 *)&(this->super_IfcElementType).super_IfcTypeProduct.super_IfcTypeObject.field_0x10 =
       0x87e2d0;
  *(undefined8 *)
   &this[-1].super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcTypeObject,_2UL>.field_0x18 = 0x87e230;
  *(undefined8 *)&this[-1].super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject.field_0xc0
       = 0x87e258;
  *(undefined8 *)&this[-1].super_IfcElementType.super_IfcTypeProduct.field_0x118 = 0x87e280;
  *(undefined8 *)&this[-1].super_IfcElementType.field_0x170 = 0x87e2a8;
  puVar1 = *(undefined1 **)&this[-1].super_IfcElementType.field_0x180;
  if (puVar1 != &this[-1].super_IfcElementType.field_0x190) {
    operator_delete(puVar1);
  }
  IfcTypeProduct::~IfcTypeProduct
            ((IfcTypeProduct *)
             &this[-1].super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject.field_0x28,
             &PTR_construction_vtable_24__0087e0c8);
  return;
}

Assistant:

IfcElementComponentType() : Object("IfcElementComponentType") {}